

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
          (Registry *this,BorderRouterArray *aRet)

{
  PersistentStorage *pPVar1;
  int iVar2;
  Status SVar3;
  BorderRouter local_1a0;
  
  pPVar1 = this->mStorage;
  BorderRouter::BorderRouter(&local_1a0);
  iVar2 = (*pPVar1->_vptr_PersistentStorage[0x17])(pPVar1,&local_1a0,aRet);
  SVar3 = kNotFound;
  if ((char)iVar2 != '\x01') {
    SVar3 = ((char)iVar2 != '\0') << 2;
  }
  local_1a0._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b7120;
  BorderAgent::~BorderAgent(&local_1a0.mAgent);
  return SVar3;
}

Assistant:

Registry::Status Registry::GetAllBorderRouters(BorderRouterArray &aRet)
{
    return MapStatus(mStorage->Lookup(BorderRouter{}, aRet));
}